

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O0

HRESULT ExecuteTest(char *fileName)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  JsErrorCode JVar4;
  size_t sVar5;
  PAL_FILE *pPVar6;
  LPCWSTR pWVar7;
  char *pcVar8;
  JsErrorCode jsErrorCode_10;
  JsErrorCode jsErrorCode_9;
  JsContextRef context_2;
  Debugger *debugger;
  JsErrorCode jsErrorCode_8;
  JsErrorCode jsErrorCode_7;
  JsErrorCode jsErrorCode_6;
  JsErrorCode jsErrorCode_5;
  JsContextRef context_1;
  size_t sStack_170;
  JsErrorCode jsErrorCode_4;
  size_t len;
  char fullPath [260];
  LPCOLESTR contentsRaw;
  JsErrorCode jsErrorCode_3;
  uint rcount;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsContextRef context;
  JsErrorCode jsErrorCode;
  UINT lengthBytes;
  JsRuntimeHandle runtime;
  LPCSTR fileContents;
  char *pcStack_18;
  HRESULT hr;
  char *fileName_local;
  
  fileContents._4_4_ = 0;
  runtime = (JsRuntimeHandle)0x0;
  _jsErrorCode = (JsRuntimeHandle)0x0;
  context._4_4_ = 0;
  pcStack_18 = fileName;
  sVar5 = strlen(fileName);
  pcVar8 = pcStack_18;
  if (0xd < sVar5) {
    sVar5 = strlen(pcStack_18);
    iVar3 = strcmp(pcVar8 + (sVar5 - 0xe),"ttdSentinal.js");
    if (iVar3 == 0) {
      if (doTTReplay == 0) {
        PAL_wprintf(L"Sentinel js file is only ok when in TTReplay mode!!!\n");
        return -0x7fffbffb;
      }
      jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
      context._0_4_ =
           ChakraRTInterface::JsTTDCreateReplayRuntime
                     (jsrtAttributes,ttUri,ttUriLength,Helpers::TTCreateStreamCallback,
                      Helpers::TTReadBytesFromStreamCallback,Helpers::TTFlushAndCloseStreamCallback,
                      (JsThreadServiceCallback)0x0,(JsRuntimeHandle *)&jsErrorCode);
      if ((JsErrorCode)context == JsNoError) {
        chRuntime = _jsErrorCode;
        _jsErrorCode_2 = (JsContextRef)0x0;
        rcount = ChakraRTInterface::JsTTDCreateContext
                           (_jsErrorCode,true,(JsContextRef *)&jsErrorCode_2);
        if (rcount == JsNoError) {
          jsErrorCode_3 = ChakraRTInterface::JsSetCurrentContext(_jsErrorCode_2);
          if (jsErrorCode_3 == JsNoError) {
            fileContents._4_4_ =
                 RunScript(pcStack_18,(LPCSTR)runtime,(ulong)context._4_4_,WScriptJsrt::FinalizeFree
                           ,(JsValueRef)0x0,(char *)0x0,(JsValueRef)0x0);
            if (-1 < fileContents._4_4_) {
              contentsRaw._4_4_ = 0;
              contentsRaw._0_4_ = ChakraRTInterface::JsSetCurrentContext((JsContextRef)0x0);
              if ((JsErrorCode)contentsRaw == JsNoError) {
                ChakraRTInterface::JsRelease(_jsErrorCode_2,(uint *)((long)&contentsRaw + 4));
                if (contentsRaw._4_4_ != 0) {
                  pPVar6 = PAL_get_stderr(0);
                  PAL_fprintf(pPVar6,"ASSERTION (%s, line %d) %s %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                              ,0x326,"rcount == 0",
                              "Should only have had 1 ref from replay code and one ref from current context??"
                             );
                  pPVar6 = PAL_get_stderr(0);
                  PAL_fflush(pPVar6);
                  DebugBreak();
                }
              }
              else {
                pPVar6 = PAL_get_stderr(0);
                JVar4 = (JsErrorCode)contentsRaw;
                pWVar7 = Helpers::JsErrorCodeToString((JsErrorCode)contentsRaw);
                PAL_fwprintf(pPVar6,
                             L"ERROR: ChakraRTInterface::JsSetCurrentContext(nullptr) failed. JsErrorCode=0x%x (%s)\n"
                             ,(ulong)JVar4,pWVar7);
                pPVar6 = PAL_get_stderr(0);
                PAL_fflush(pPVar6);
              }
            }
          }
          else {
            pPVar6 = PAL_get_stderr(0);
            JVar4 = jsErrorCode_3;
            pWVar7 = Helpers::JsErrorCodeToString(jsErrorCode_3);
            PAL_fwprintf(pPVar6,
                         L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar4,pWVar7);
            pPVar6 = PAL_get_stderr(0);
            PAL_fflush(pPVar6);
          }
        }
        else {
          pPVar6 = PAL_get_stderr(0);
          uVar1 = rcount;
          pWVar7 = Helpers::JsErrorCodeToString(rcount);
          PAL_fwprintf(pPVar6,
                       L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)uVar1,pWVar7);
          pPVar6 = PAL_get_stderr(0);
          PAL_fflush(pPVar6);
        }
      }
      else {
        pPVar6 = PAL_get_stderr(0);
        JVar4 = (JsErrorCode)context;
        pWVar7 = Helpers::JsErrorCodeToString((JsErrorCode)context);
        PAL_fwprintf(pPVar6,
                     L"ERROR: ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar4,pWVar7);
        pPVar6 = PAL_get_stderr(0);
        PAL_fflush(pPVar6);
      }
      goto LAB_0010ac63;
    }
  }
  sStack_170 = 0;
  fileContents._4_4_ =
       Helpers::LoadScriptFromFile
                 (pcStack_18,(LPCSTR *)&runtime,(UINT *)((long)&context + 4),(string *)0x0,false);
  if (fileContents._4_4_ < 0) goto LAB_0010ac63;
  if ((HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled & 1U) != 0) {
    jsrtAttributes = jsrtAttributes | 0x8000000;
  }
  if (doTTRecord == 0) {
    if (doTTReplay != 0) {
      pPVar6 = PAL_get_stderr(0);
      PAL_fprintf(pPVar6,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ch.cpp"
                  ,0x34e,"!doTTReplay","Should be handled in the else case above!!!");
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      DebugBreak();
    }
    debugger._0_4_ =
         ChakraRTInterface::JsCreateRuntime
                   (jsrtAttributes,(JsThreadServiceCallback)0x0,(JsRuntimeHandle *)&jsErrorCode);
    if ((JsErrorCode)debugger != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      JVar4 = (JsErrorCode)debugger;
      pWVar7 = Helpers::JsErrorCodeToString((JsErrorCode)debugger);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
    chRuntime = _jsErrorCode;
    if ((HostConfigFlags::flags.DebugLaunch & 1U) != 0) {
      context_2 = Debugger::GetDebugger(_jsErrorCode);
      Debugger::StartDebugging((Debugger *)context_2,_jsErrorCode);
    }
    _jsErrorCode_10 = (JsContextRef)0x0;
    JVar4 = ChakraRTInterface::JsCreateContext(_jsErrorCode,(JsContextRef *)&jsErrorCode_10);
    if (JVar4 != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      pWVar7 = Helpers::JsErrorCodeToString(JVar4);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
    JVar4 = ChakraRTInterface::JsSetCurrentContext(_jsErrorCode_10);
    if (JVar4 != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      pWVar7 = Helpers::JsErrorCodeToString(JVar4);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
  }
  else {
    jsrtAttributes = jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures;
    context_1._4_4_ =
         ChakraRTInterface::JsTTDCreateRecordRuntime
                   (jsrtAttributes,(ulong)snapInterval,(ulong)snapHistoryLength,
                    Helpers::TTCreateStreamCallback,Helpers::TTWriteBytesToStreamCallback,
                    Helpers::TTFlushAndCloseStreamCallback,(JsThreadServiceCallback)0x0,
                    (JsRuntimeHandle *)&jsErrorCode);
    if (context_1._4_4_ != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      JVar4 = context_1._4_4_;
      pWVar7 = Helpers::JsErrorCodeToString(context_1._4_4_);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
    chRuntime = _jsErrorCode;
    _jsErrorCode_6 = (JsContextRef)0x0;
    jsErrorCode_7 =
         ChakraRTInterface::JsTTDCreateContext(_jsErrorCode,true,(JsContextRef *)&jsErrorCode_6);
    if (jsErrorCode_7 != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      JVar4 = jsErrorCode_7;
      pWVar7 = Helpers::JsErrorCodeToString(jsErrorCode_7);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsTTDCreateContext(runtime, true, &context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
    jsErrorCode_8 = ChakraRTInterface::JsSetCurrentContext(_jsErrorCode_6);
    if (jsErrorCode_8 != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      JVar4 = jsErrorCode_8;
      pWVar7 = Helpers::JsErrorCodeToString(jsErrorCode_8);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
    debugger._4_4_ =
         ChakraRTInterface::JsSetObjectBeforeCollectCallback
                   (_jsErrorCode_6,(void *)0x0,WScriptJsrt::JsContextBeforeCollectCallback);
    if (debugger._4_4_ != JsNoError) {
      pPVar6 = PAL_get_stderr(0);
      JVar4 = debugger._4_4_;
      pWVar7 = Helpers::JsErrorCodeToString(debugger._4_4_);
      PAL_fwprintf(pPVar6,
                   L"ERROR: ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar4,pWVar7);
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      goto LAB_0010ac63;
    }
  }
  ChakraRTInterface::SetCheckOpHelpersFlag(true);
  bVar2 = WScriptJsrt::Initialize();
  if (bVar2) {
    pcVar8 = _fullpath((char *)&len,pcStack_18,0x104);
    if (pcVar8 == (char *)0x0) {
      fileContents._4_4_ = -0x7fffbffb;
    }
    else {
      if ((HostConfigFlags::flags.TrackRejectedPromises & 1U) != 0) {
        ChakraRTInterface::JsSetHostPromiseRejectionTracker
                  (WScriptJsrt::PromiseRejectionTrackerCallback,(void *)0x0);
      }
      sStack_170 = strlen((char *)&len);
      if ((HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled & 1U) == 0) {
        if ((HostConfigFlags::flags.SerializedIsEnabled & 1U) == 0) {
          if ((HostConfigFlags::flags.GenerateParserStateCacheIsEnabled & 1U) == 0) {
            if ((HostConfigFlags::flags.UseParserStateCacheIsEnabled & 1U) == 0) {
              fileContents._4_4_ =
                   RunScript(pcStack_18,(LPCSTR)runtime,(ulong)context._4_4_,
                             WScriptJsrt::FinalizeFree,(JsValueRef)0x0,(char *)&len,(JsValueRef)0x0)
              ;
            }
            else {
              CreateParserStateAndRunScript
                        (pcStack_18,(LPCSTR)runtime,(ulong)context._4_4_,WScriptJsrt::FinalizeFree,
                         (char *)&len);
            }
          }
          else {
            CreateParserState((LPCSTR)runtime,(ulong)context._4_4_,WScriptJsrt::FinalizeFree,
                              (LPCWSTR)0x0);
          }
        }
        else {
          CreateAndRunSerializedScript
                    (pcStack_18,(LPCSTR)runtime,(ulong)context._4_4_,WScriptJsrt::FinalizeFree,
                     (char *)&len);
        }
      }
      else {
        fileContents._4_4_ = CreateLibraryByteCode((char *)runtime);
      }
    }
  }
  else {
    fileContents._4_4_ = -0x7fffbffb;
  }
LAB_0010ac63:
  if (Debugger::debugger != (Debugger *)0x0) {
    Debugger::CompareOrWriteBaselineFile(Debugger::debugger,pcStack_18);
    Debugger::CloseDebugger();
  }
  ChakraRTInterface::JsSetCurrentContext((JsContextRef)0x0);
  if (_jsErrorCode != (JsRuntimeHandle)0x0) {
    ChakraRTInterface::JsDisposeRuntime(_jsErrorCode);
  }
  PAL__flushall();
  return fileContents._4_4_;
}

Assistant:

HRESULT ExecuteTest(const char* fileName)
{
    HRESULT hr = S_OK;
    LPCSTR fileContents = nullptr;
    JsRuntimeHandle runtime = JS_INVALID_RUNTIME_HANDLE;
    UINT lengthBytes = 0;

    if(strlen(fileName) >= 14 && strcmp(fileName + strlen(fileName) - 14, "ttdSentinal.js") == 0)
    {
#if !ENABLE_TTD
        wprintf(_u("Sentinel js file is only ok when in TTDebug mode!!!\n"));
        return E_FAIL;
#else
        if(!doTTReplay)
        {
            wprintf(_u("Sentinel js file is only ok when in TTReplay mode!!!\n"));
            return E_FAIL;
        }

        jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateReplayRuntime(jsrtAttributes, ttUri, ttUriLength, Helpers::TTCreateStreamCallback, Helpers::TTReadBytesFromStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
        chRuntime = runtime;

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

        IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, nullptr, nullptr));

        unsigned int rcount = 0;
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(nullptr));
        ChakraRTInterface::JsRelease(context, &rcount);
        AssertMsg(rcount == 0, "Should only have had 1 ref from replay code and one ref from current context??");
#endif
    }
    else
    {
        LPCOLESTR contentsRaw = nullptr;

        char fullPath[_MAX_PATH];
        size_t len = 0;

        hr = Helpers::LoadScriptFromFile(fileName, fileContents, &lengthBytes);
        contentsRaw; lengthBytes; // Unused for now.

        IfFailGo(hr);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            jsrtAttributes = (JsRuntimeAttributes)(jsrtAttributes | JsRuntimeAttributeSerializeLibraryByteCode);
        }

#if ENABLE_TTD
        if (doTTRecord)
        {
            //Ensure we run with experimental features (as that is what Node does right now).
            jsrtAttributes = static_cast<JsRuntimeAttributes>(jsrtAttributes | JsRuntimeAttributeEnableExperimentalFeatures);

            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateRecordRuntime(jsrtAttributes, snapInterval, snapHistoryLength, Helpers::TTCreateStreamCallback, Helpers::TTWriteBytesToStreamCallback, Helpers::TTFlushAndCloseStreamCallback, nullptr, &runtime));
            chRuntime = runtime;

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsTTDCreateContext(runtime, true, &context));

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));

#if ENABLE_TTD
            //We need this here since this context is created in record
            IfJsErrorFailLog(ChakraRTInterface::JsSetObjectBeforeCollectCallback(context, nullptr, WScriptJsrt::JsContextBeforeCollectCallback));
#endif
        }
        else
        {
            AssertMsg(!doTTReplay, "Should be handled in the else case above!!!");

            IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
            chRuntime = runtime;

            if (HostConfigFlags::flags.DebugLaunch)
            {
                Debugger* debugger = Debugger::GetDebugger(runtime);
                debugger->StartDebugging(runtime);
            }

            JsContextRef context = JS_INVALID_REFERENCE;
            IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));

            //Don't need collect callback since this is always in replay

            IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
        }
#else
        IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(jsrtAttributes, nullptr, &runtime));
        chRuntime = runtime;

        if (HostConfigFlags::flags.DebugLaunch)
        {
            Debugger* debugger = Debugger::GetDebugger(runtime);
            debugger->StartDebugging(runtime);
        }

        JsContextRef context = JS_INVALID_REFERENCE;
        IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
        IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));
#endif

#ifdef DEBUG
        ChakraRTInterface::SetCheckOpHelpersFlag(true);
#endif

        if (!WScriptJsrt::Initialize())
        {
            IfFailGo(E_FAIL);
        }

        if (_fullpath(fullPath, fileName, _MAX_PATH) == nullptr)
        {
            IfFailGo(E_FAIL);
        }

        if (HostConfigFlags::flags.TrackRejectedPromises)
        {
            ChakraRTInterface::JsSetHostPromiseRejectionTracker(WScriptJsrt::PromiseRejectionTrackerCallback, nullptr);
        }
        
        len = strlen(fullPath);
        if (HostConfigFlags::flags.GenerateLibraryByteCodeHeaderIsEnabled)
        {
            IfFailGo(CreateLibraryByteCode(fileContents));
        }
        else if (HostConfigFlags::flags.SerializedIsEnabled)
        {
            CreateAndRunSerializedScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else if (HostConfigFlags::flags.GenerateParserStateCacheIsEnabled)
        {
            CreateParserState(fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr);
        }
        else if (HostConfigFlags::flags.UseParserStateCacheIsEnabled)
        {
            CreateParserStateAndRunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, fullPath);
        }
        else
        {
            IfFailGo(RunScript(fileName, fileContents, lengthBytes, WScriptJsrt::FinalizeFree, nullptr, fullPath, nullptr));
        }
    }
Error:
    if (Debugger::debugger != nullptr)
    {
        Debugger::debugger->CompareOrWriteBaselineFile(fileName);
        Debugger::CloseDebugger();
    }

    ChakraRTInterface::JsSetCurrentContext(nullptr);

    if (runtime != JS_INVALID_RUNTIME_HANDLE)
    {
        ChakraRTInterface::JsDisposeRuntime(runtime);
    }

    _flushall();

    return hr;
}